

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

bool __thiscall
ArgsManager::ReadSettingsFile
          (ArgsManager *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_00;
  string key_00;
  bool bVar2;
  undefined1 uVar3;
  optional<unsigned_int> oVar4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_errors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  KeyInfo key;
  path path;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  _Rb_tree_node_base *p_Var6;
  char *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  unique_lock<std::recursive_mutex> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  KeyInfo local_a8;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_60);
  bVar2 = GetSettingsPath(this,(path *)&local_60,false,false);
  uVar3 = 1;
  if (bVar2) {
    local_f8._M_owns = false;
    local_f8._M_device = (mutex_type *)this;
    std::unique_lock<std::recursive_mutex>::lock(&local_f8);
    this_00 = &(this->m_settings).rw_settings;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::clear(&this_00->_M_t);
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = common::ReadSettings((path *)&local_60,this_00,&local_118);
    p_Var6 = (_Rb_tree_node_base *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    if ((bool)uVar3) {
      p_Var5 = (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        do {
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,*(long *)(p_Var5 + 1),
                     (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
          key_00._M_string_length = (size_type)in_stack_fffffffffffffec0;
          key_00._M_dataplus._M_p = (pointer)p_Var6;
          key_00.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffffec8;
          key_00.field_2._M_local_buf[7] = uVar3;
          key_00.field_2._8_8_ = in_stack_fffffffffffffed0;
          InterpretKey(&local_a8,key_00);
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0],local_b8[0] + 1);
          }
          std::operator+(&local_e8,'-',&local_a8.name);
          oVar4 = GetArgFlags(this,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
            p_Var6 = p_Var5 + 1;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
            ;
            source_file._M_len = 0x58;
            logging_function._M_str = "ReadSettingsFile";
            logging_function._M_len = 0x10;
            LogPrintf_<std::__cxx11::string>
                      (logging_function,source_file,0x1a3,
                       I2P|QT|COINDB|RAND|REINDEX|SELECTCOINS|ZMQ|BENCH|HTTP|MEMPOOL,(Level)p_Var6,
                       in_stack_fffffffffffffec0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar3,in_stack_fffffffffffffec8));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.section._M_dataplus._M_p != &local_a8.section.field_2) {
            operator_delete(local_a8.section._M_dataplus._M_p,
                            local_a8.section.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8.name._M_dataplus._M_p != &local_a8.name.field_2) {
            operator_delete(local_a8.name._M_dataplus._M_p,
                            local_a8.name.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xfffffffffffffed0,&local_118);
      errors_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffebc;
      errors_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffffeb8;
      errors_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffec0;
      errors_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffffec8;
      errors_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = uVar3;
      SaveErrors(errors_00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffed0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffed0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  }
  std::filesystem::__cxx11::path::~path(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool ArgsManager::ReadSettingsFile(std::vector<std::string>* errors)
{
    fs::path path;
    if (!GetSettingsPath(&path, /* temp= */ false)) {
        return true; // Do nothing if settings file disabled.
    }

    LOCK(cs_args);
    m_settings.rw_settings.clear();
    std::vector<std::string> read_errors;
    if (!common::ReadSettings(path, m_settings.rw_settings, read_errors)) {
        SaveErrors(read_errors, errors);
        return false;
    }
    for (const auto& setting : m_settings.rw_settings) {
        KeyInfo key = InterpretKey(setting.first); // Split setting key into section and argname
        if (!GetArgFlags('-' + key.name)) {
            LogPrintf("Ignoring unknown rw_settings value %s\n", setting.first);
        }
    }
    return true;
}